

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void cpy_C0(void)

{
  except = '\0';
  temp1 = getbyte(pc);
  _AL = y_reg;
  _AH = temp1;
  carry_f = '\x01';
  result_f = '@';
  pc = pc + 1;
  return;
}

Assistant:

void cpy_C0(void) {
    uint flags;
    CLE;

    temp1 = getbyte(pc);

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = y_reg;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
}